

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O2

bool __thiscall AbstractStringSerialiser::loadModel(AbstractStringSerialiser *this,QString *source)

{
  undefined1 uVar1;
  QString sourceCopy;
  QArrayDataPointer<char16_t> local_20;
  
  local_20.d = (source->d).d;
  local_20.ptr = (source->d).ptr;
  local_20.size = (source->d).size;
  if (local_20.d != (Data *)0x0) {
    LOCK();
    ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  uVar1 = (**(code **)(*(long *)&this->super_AbstractModelSerialiser + 200))(this,&local_20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20);
  return (bool)uVar1;
}

Assistant:

QVariant AbstractStringSerialiserPrivate::loadVariant(int type, const QString &val) const
{
    if (val.isEmpty())
        return QVariant();
    switch (type) {
    case QMetaType::UnknownType:
        Q_ASSERT_X(false, "ModelSerialisation::loadVariant", "Trying to load unregistered type.");
        return QVariant();
    case QMetaType::Bool:
        return val.toInt() == 1;
    case QMetaType::Long:
    case QMetaType::Int:
        return val.toInt();
    case QMetaType::ULong:
    case QMetaType::UInt:
        return val.toUInt();
    case QMetaType::LongLong:
        return val.toLongLong();
    case QMetaType::ULongLong:
        return val.toULongLong();
    case QMetaType::Double:
        return val.toDouble();
    case QMetaType::Short:
        return static_cast<short>(val.toInt());
    case QMetaType::SChar:
    case QMetaType::Char:
        return static_cast<char>(val.toInt());
    case QMetaType::UShort:
        return static_cast<unsigned short>(val.toUInt());
    case QMetaType::UChar:
        return static_cast<unsigned char>(val.toUInt());
    case QMetaType::Float:
        return val.toFloat();
    case QMetaType::QChar:
        return val.at(0);
    case QMetaType::QString:
        return val;
    case QMetaType::QByteArray:
        return QByteArray::fromBase64(val.toLatin1());
    case QMetaType::QDate:
        return QDate::fromString(val, Qt::ISODate);
    case QMetaType::QTime:
        return QTime::fromString(val, Qt::ISODate);
    case QMetaType::QDateTime:
        return QDateTime::fromString(val, Qt::ISODate);
#ifdef QT_GUI_LIB
    case QMetaType::QImage:
        return loadImageVariant(type, val);
    case QMetaType::QPixmap:
        return QPixmap::fromImage(loadImageVariant(type, val));
    case QMetaType::QBitmap:
        return QBitmap::fromImage(loadImageVariant(type, val));
#endif
    default:
        return stringToVariant(val);
    }
}